

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O1

int xmlUCSIsCatZs(int code)

{
  if (code < 0x1680) {
    if (code == 0x20) {
      return 1;
    }
    if (code == 0xa0) {
      return 1;
    }
  }
  else {
    if (code == 0x1680) {
      return 1;
    }
    if (code == 0x180e) {
      return 1;
    }
  }
  if (((10 < code - 0x2000U) && (code != 0x202f)) && (code != 0x205f)) {
    return (int)(code == 0x3000);
  }
  return 1;
}

Assistant:

int
xmlUCSIsCatZs(int code) {
    return((code == 0x20) ||
           (code == 0xa0) ||
           (code == 0x1680) ||
           (code == 0x180e) ||
           ((code >= 0x2000) && (code <= 0x200a)) ||
           (code == 0x202f) ||
           (code == 0x205f) ||
           (code == 0x3000));
}